

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int zeroJournalHdr(Pager *pPager,int doTruncate)

{
  long local_28;
  i64 sz;
  i64 iLimit;
  int rc;
  int doTruncate_local;
  Pager *pPager_local;
  
  iLimit._0_4_ = 0;
  if (pPager->journalOff != 0) {
    sz = pPager->journalSizeLimit;
    iLimit._4_4_ = doTruncate;
    _rc = pPager;
    if ((doTruncate == 0) && (sz != 0)) {
      iLimit._0_4_ = sqlite3OsWrite(pPager->jfd,"",0x1c,0);
    }
    else {
      iLimit._0_4_ = sqlite3OsTruncate(pPager->jfd,0);
    }
    if (((int)iLimit == 0) && (_rc->noSync == '\0')) {
      iLimit._0_4_ = sqlite3OsSync(_rc->jfd,_rc->syncFlags | 0x10);
    }
    if (((((int)iLimit == 0) && (0 < sz)) &&
        (iLimit._0_4_ = sqlite3OsFileSize(_rc->jfd,&local_28), (int)iLimit == 0)) && (sz < local_28)
       ) {
      iLimit._0_4_ = sqlite3OsTruncate(_rc->jfd,sz);
    }
  }
  return (int)iLimit;
}

Assistant:

static int zeroJournalHdr(Pager *pPager, int doTruncate){
  int rc = SQLITE_OK;                               /* Return code */
  assert( isOpen(pPager->jfd) );
  assert( !sqlite3JournalIsInMemory(pPager->jfd) );
  if( pPager->journalOff ){
    const i64 iLimit = pPager->journalSizeLimit;    /* Local cache of jsl */

    IOTRACE(("JZEROHDR %p\n", pPager))
    if( doTruncate || iLimit==0 ){
      rc = sqlite3OsTruncate(pPager->jfd, 0);
    }else{
      static const char zeroHdr[28] = {0};
      rc = sqlite3OsWrite(pPager->jfd, zeroHdr, sizeof(zeroHdr), 0);
    }
    if( rc==SQLITE_OK && !pPager->noSync ){
      rc = sqlite3OsSync(pPager->jfd, SQLITE_SYNC_DATAONLY|pPager->syncFlags);
    }

    /* At this point the transaction is committed but the write lock 
    ** is still held on the file. If there is a size limit configured for 
    ** the persistent journal and the journal file currently consumes more
    ** space than that limit allows for, truncate it now. There is no need
    ** to sync the file following this operation.
    */
    if( rc==SQLITE_OK && iLimit>0 ){
      i64 sz;
      rc = sqlite3OsFileSize(pPager->jfd, &sz);
      if( rc==SQLITE_OK && sz>iLimit ){
        rc = sqlite3OsTruncate(pPager->jfd, iLimit);
      }
    }
  }
  return rc;
}